

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isLookupResultValid
               (TextureCubeView *texture,Sampler *sampler,LookupPrecision *prec,Vec3 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  ConstPixelBufferAccess **ppCVar1;
  int *piVar2;
  float __x;
  CubeFace CVar3;
  ConstPixelBufferAccess *pCVar4;
  TextureFormat TVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  ConstPixelBufferAccess **ppCVar11;
  FilterMode FVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 local_2b0 [12];
  int numPossibleFaces;
  Vec2 local_2a0;
  undefined1 local_298 [16];
  TextureCubeView *local_280;
  Vec3 *local_278;
  Vec2 *local_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  ConstPixelBufferAccess faces [6];
  CubeFace possibleFaces [6];
  ConstPixelBufferAccess faces1 [6];
  
  numPossibleFaces = 0;
  local_278 = coord;
  local_270 = lodBounds;
  TexVerifierUtil::getPossibleCubeFaces(coord,&prec->coordBits,possibleFaces,&numPossibleFaces);
  bVar8 = true;
  if (numPossibleFaces != 0) {
    if (0 < numPossibleFaces) {
      ppCVar1 = texture->m_levels;
      lVar15 = 0;
      local_280 = texture;
      do {
        CVar3 = possibleFaces[lVar15];
        projectToFace((CubeFace)faces,(Vec3 *)(ulong)CVar3);
        local_2b0._4_4_ = faces[0].m_format.order;
        local_2b0._8_4_ = faces[0].m_format.type;
        fVar18 = local_270->m_data[0];
        __x = local_270->m_data[1];
        fVar17 = sampler->lodThreshold;
        local_2b0._0_4_ = CVar3;
        if (fVar18 <= fVar17) {
          local_298._0_4_ = fVar17;
          lVar14 = 0;
          do {
            ConstPixelBufferAccess::ConstPixelBufferAccess
                      ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar14 + -8));
            lVar14 = lVar14 + 0x28;
          } while (lVar14 != 0xf0);
          lVar14 = 0;
          ppCVar11 = ppCVar1;
          do {
            pCVar4 = *ppCVar11;
            *(void **)((long)(&faces[0].m_pitch + 1) + lVar14 * 8) = pCVar4->m_data;
            TVar5 = pCVar4->m_format;
            uVar6 = *(undefined8 *)(pCVar4->m_size).m_data;
            uVar7 = *(undefined8 *)((pCVar4->m_pitch).m_data + 1);
            *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + -1) =
                 *(undefined8 *)((pCVar4->m_size).m_data + 2);
            *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + 1) = uVar7;
            *(TextureFormat *)(faces[0].m_size.m_data + lVar14 * 2 + -2) = TVar5;
            *(undefined8 *)(faces[0].m_size.m_data + lVar14 * 2) = uVar6;
            lVar14 = lVar14 + 5;
            ppCVar11 = ppCVar11 + 1;
          } while (lVar14 != 0x1e);
          bVar8 = isCubeLevelSampleResultValid
                            (&faces,sampler,sampler->magFilter,prec,(CubeFaceFloatCoords *)local_2b0
                             ,result);
          fVar17 = (float)local_298._0_4_;
          if (bVar8) {
            return true;
          }
        }
        if (fVar17 < __x) {
          FVar12 = sampler->minFilter;
          iVar16 = local_280->m_numLevels;
          iVar13 = iVar16 + -1;
          if (iVar13 < 1 || (FVar12 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
            if ((FVar12 == LINEAR_MIPMAP_NEAREST) || (FVar12 == NEAREST_MIPMAP_NEAREST)) {
              fVar18 = ceilf(fVar18 + 0.5);
              iVar9 = (int)fVar18 + -1;
              iVar16 = iVar13;
              if (iVar9 < iVar13) {
                iVar16 = iVar9;
              }
              if (iVar9 < 0) {
                iVar16 = 0;
              }
              fVar18 = floorf(__x + 0.5);
              iVar9 = (int)fVar18;
              if (iVar9 < iVar13) {
                iVar13 = iVar9;
              }
              if (iVar9 < 0) {
                iVar13 = 0;
              }
              for (; iVar16 <= iVar13; iVar16 = iVar16 + 1) {
                lVar14 = 0;
                do {
                  ConstPixelBufferAccess::ConstPixelBufferAccess
                            ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar14 + -8))
                  ;
                  lVar14 = lVar14 + 0x28;
                } while (lVar14 != 0xf0);
                lVar14 = 0;
                ppCVar11 = ppCVar1;
                do {
                  pCVar4 = *ppCVar11;
                  *(void **)((long)(&faces[0].m_pitch + 1) + lVar14 * 8) = pCVar4[iVar16].m_data;
                  TVar5 = pCVar4[iVar16].m_format;
                  uVar6 = *(undefined8 *)pCVar4[iVar16].m_size.m_data;
                  piVar2 = pCVar4[iVar16].m_size.m_data + 2;
                  uVar7 = *(undefined8 *)(piVar2 + 2);
                  *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + -1) = *(undefined8 *)piVar2
                  ;
                  *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + 1) = uVar7;
                  *(TextureFormat *)(faces[0].m_size.m_data + lVar14 * 2 + -2) = TVar5;
                  *(undefined8 *)(faces[0].m_size.m_data + lVar14 * 2) = uVar6;
                  lVar14 = lVar14 + 5;
                  ppCVar11 = ppCVar11 + 1;
                } while (lVar14 != 0x1e);
                uVar10 = sampler->minFilter - LINEAR;
                FVar12 = NEAREST;
                if (uVar10 < 5) {
                  FVar12 = *(FilterMode *)(&DAT_01cd47c0 + (ulong)uVar10 * 4);
                }
                bVar8 = isCubeLevelSampleResultValid
                                  (&faces,sampler,FVar12,prec,(CubeFaceFloatCoords *)local_2b0,
                                   result);
                if (bVar8) {
                  return true;
                }
              }
            }
            else {
              lVar14 = 0;
              do {
                ConstPixelBufferAccess::ConstPixelBufferAccess
                          ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar14 + -8));
                lVar14 = lVar14 + 0x28;
              } while (lVar14 != 0xf0);
              lVar14 = 0;
              ppCVar11 = ppCVar1;
              do {
                pCVar4 = *ppCVar11;
                *(void **)((long)(&faces[0].m_pitch + 1) + lVar14 * 8) = pCVar4->m_data;
                TVar5 = pCVar4->m_format;
                uVar6 = *(undefined8 *)(pCVar4->m_size).m_data;
                uVar7 = *(undefined8 *)((pCVar4->m_pitch).m_data + 1);
                *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + -1) =
                     *(undefined8 *)((pCVar4->m_size).m_data + 2);
                *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + 1) = uVar7;
                *(TextureFormat *)(faces[0].m_size.m_data + lVar14 * 2 + -2) = TVar5;
                *(undefined8 *)(faces[0].m_size.m_data + lVar14 * 2) = uVar6;
                lVar14 = lVar14 + 5;
                ppCVar11 = ppCVar11 + 1;
              } while (lVar14 != 0x1e);
              bVar8 = isCubeLevelSampleResultValid
                                (&faces,sampler,sampler->minFilter,prec,
                                 (CubeFaceFloatCoords *)local_2b0,result);
              if (bVar8) {
                return true;
              }
            }
          }
          else {
            fVar17 = floorf(fVar18);
            iVar9 = (int)fVar17;
            iVar16 = iVar16 + -2;
            iVar13 = iVar16;
            if (iVar9 < iVar16) {
              iVar13 = iVar9;
            }
            if (iVar9 < 0) {
              iVar13 = 0;
            }
            fVar17 = floorf(__x);
            iVar9 = (int)fVar17;
            if (iVar9 < iVar16) {
              iVar16 = iVar9;
            }
            if (iVar9 < 0) {
              iVar16 = 0;
            }
            while (iVar13 <= iVar16) {
              fVar19 = fVar18 - (float)iVar13;
              local_298 = ZEXT416((uint)fVar19);
              fVar17 = 1.0;
              if (fVar19 <= 1.0) {
                fVar17 = fVar19;
              }
              local_268 = ZEXT416((uint)fVar17);
              fVar19 = __x - (float)iVar13;
              local_248 = ZEXT416((uint)fVar19);
              fVar17 = 1.0;
              if (fVar19 <= 1.0) {
                fVar17 = fVar19;
              }
              local_258 = ZEXT416((uint)fVar17);
              lVar14 = 0;
              do {
                ConstPixelBufferAccess::ConstPixelBufferAccess
                          ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar14 + -8));
                lVar14 = lVar14 + 0x28;
              } while (lVar14 != 0xf0);
              lVar14 = 0;
              do {
                ConstPixelBufferAccess::ConstPixelBufferAccess
                          ((ConstPixelBufferAccess *)((long)faces1[0].m_size.m_data + lVar14 + -8));
                lVar14 = lVar14 + 0x28;
              } while (lVar14 != 0xf0);
              local_2a0.m_data[0] =
                   (float)(~-(uint)((float)local_298._0_4_ < 0.0) & local_268._0_4_);
              lVar14 = 0;
              ppCVar11 = ppCVar1;
              do {
                pCVar4 = *ppCVar11;
                *(void **)((long)(&faces[0].m_pitch + 1) + lVar14 * 8) = pCVar4[iVar13].m_data;
                TVar5 = pCVar4[iVar13].m_format;
                uVar6 = *(undefined8 *)pCVar4[iVar13].m_size.m_data;
                piVar2 = pCVar4[iVar13].m_size.m_data + 2;
                uVar7 = *(undefined8 *)(piVar2 + 2);
                *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + -1) = *(undefined8 *)piVar2;
                *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + 1) = uVar7;
                *(TextureFormat *)(faces[0].m_size.m_data + lVar14 * 2 + -2) = TVar5;
                *(undefined8 *)(faces[0].m_size.m_data + lVar14 * 2) = uVar6;
                lVar14 = lVar14 + 5;
                ppCVar11 = ppCVar11 + 1;
              } while (lVar14 != 0x1e);
              iVar13 = iVar13 + 1;
              lVar14 = 0;
              ppCVar11 = ppCVar1;
              do {
                pCVar4 = *ppCVar11;
                *(void **)((long)(&faces1[0].m_pitch + 1) + lVar14 * 8) = pCVar4[iVar13].m_data;
                TVar5 = pCVar4[iVar13].m_format;
                uVar6 = *(undefined8 *)pCVar4[iVar13].m_size.m_data;
                piVar2 = pCVar4[iVar13].m_size.m_data + 2;
                uVar7 = *(undefined8 *)(piVar2 + 2);
                *(undefined8 *)(faces1[0].m_pitch.m_data + lVar14 * 2 + -1) = *(undefined8 *)piVar2;
                *(undefined8 *)(faces1[0].m_pitch.m_data + lVar14 * 2 + 1) = uVar7;
                *(TextureFormat *)(faces1[0].m_size.m_data + lVar14 * 2 + -2) = TVar5;
                *(undefined8 *)(faces1[0].m_size.m_data + lVar14 * 2) = uVar6;
                lVar14 = lVar14 + 5;
                ppCVar11 = ppCVar11 + 1;
              } while (lVar14 != 0x1e);
              uVar10 = sampler->minFilter - LINEAR;
              FVar12 = NEAREST;
              if (uVar10 < 5) {
                FVar12 = *(FilterMode *)(&DAT_01cd47c0 + (ulong)uVar10 * 4);
              }
              local_2a0.m_data[1] =
                   (float)(~-(uint)((float)local_248._0_4_ < 0.0) & local_258._0_4_);
              bVar8 = isCubeMipmapLinearSampleResultValid
                                (&faces,&faces1,sampler,FVar12,prec,(CubeFaceFloatCoords *)local_2b0
                                 ,&local_2a0,result);
              if (bVar8) {
                return true;
              }
            }
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < numPossibleFaces);
    }
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool isLookupResultValid (const TextureCubeView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec3& coord, const Vec2& lodBounds, const Vec4& result)
{
	int			numPossibleFaces				= 0;
	CubeFace	possibleFaces[CUBEFACE_LAST];

	DE_ASSERT(isSamplerSupported(sampler));

	getPossibleCubeFaces(coord, prec.coordBits, &possibleFaces[0], numPossibleFaces);

	if (numPossibleFaces == 0)
		return true; // Result is undefined.

	for (int tryFaceNdx = 0; tryFaceNdx < numPossibleFaces; tryFaceNdx++)
	{
		const CubeFaceFloatCoords	faceCoords		(possibleFaces[tryFaceNdx], projectToFace(possibleFaces[tryFaceNdx], coord));
		const float					minLod			= lodBounds.x();
		const float					maxLod			= lodBounds.y();
		const bool					canBeMagnified	= minLod <= sampler.lodThreshold;
		const bool					canBeMinified	= maxLod > sampler.lodThreshold;

		if (canBeMagnified)
		{
			ConstPixelBufferAccess faces[CUBEFACE_LAST];
			getCubeLevelFaces(texture, 0, faces);

			if (isCubeLevelSampleResultValid(faces, sampler, sampler.magFilter, prec, faceCoords, result))
				return true;
		}

		if (canBeMinified)
		{
			const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
			const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
			const int	minTexLevel		= 0;
			const int	maxTexLevel		= texture.getNumLevels()-1;

			DE_ASSERT(minTexLevel <= maxTexLevel);

			if (isLinearMipmap && minTexLevel < maxTexLevel)
			{
				const int	minLevel	= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
				const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

				DE_ASSERT(minLevel <= maxLevel);

				for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
				{
					const float				minF	= de::clamp(minLod - float(levelNdx), 0.0f, 1.0f);
					const float				maxF	= de::clamp(maxLod - float(levelNdx), 0.0f, 1.0f);

					ConstPixelBufferAccess	faces0[CUBEFACE_LAST];
					ConstPixelBufferAccess	faces1[CUBEFACE_LAST];

					getCubeLevelFaces(texture, levelNdx,		faces0);
					getCubeLevelFaces(texture, levelNdx + 1,	faces1);

					if (isCubeMipmapLinearSampleResultValid(faces0, faces1, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, Vec2(minF, maxF), result))
						return true;
				}
			}
			else if (isNearestMipmap)
			{
				// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
				//		 decision to allow floor(lod + 0.5) as well.
				const int	minLevel	= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
				const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

				DE_ASSERT(minLevel <= maxLevel);

				for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
				{
					ConstPixelBufferAccess faces[CUBEFACE_LAST];
					getCubeLevelFaces(texture, levelNdx, faces);

					if (isCubeLevelSampleResultValid(faces, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, result))
						return true;
				}
			}
			else
			{
				ConstPixelBufferAccess faces[CUBEFACE_LAST];
				getCubeLevelFaces(texture, 0, faces);

				if (isCubeLevelSampleResultValid(faces, sampler, sampler.minFilter, prec, faceCoords, result))
					return true;
			}
		}
	}

	return false;
}